

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_rotate.cpp
# Opt level: O3

size_t embree::sse2::BVHNRotate<4>::rotate(NodeRef parentRef,size_t depth)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined4 uVar18;
  long in_R8;
  ulong uVar20;
  long lVar21;
  long in_R9;
  ulong uVar22;
  long in_R10;
  ulong uVar23;
  size_t c;
  long lVar24;
  int iVar25;
  bool bVar26;
  uint uVar27;
  uint uVar34;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar83;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar90;
  float fVar91;
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 cdepth;
  int pos [4];
  vfloat4 area0123;
  vfloat4 childArea;
  float local_17c;
  int local_178 [4];
  int local_168 [4];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38 [4];
  ulong uVar19;
  undefined1 auVar31 [16];
  
  if ((parentRef.ptr & 0x8000000000000008) == 0) {
    lVar24 = 0;
    do {
      sVar13 = rotate((NodeRef)*(size_t *)(parentRef.ptr + lVar24 * 8),depth + 1);
      local_178[lVar24] = (int)sVar13;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 4);
    local_b8 = *(float *)(parentRef.ptr + 0x20);
    local_78 = *(float *)(parentRef.ptr + 0x2c);
    fStack_b4 = *(float *)(parentRef.ptr + 0x40);
    fStack_74 = *(float *)(parentRef.ptr + 0x4c);
    fVar56 = *(float *)(parentRef.ptr + 0x50) - fStack_b4;
    fVar63 = *(float *)(parentRef.ptr + 0x54) - *(float *)(parentRef.ptr + 0x44);
    fVar64 = *(float *)(parentRef.ptr + 0x58) - *(float *)(parentRef.ptr + 0x48);
    fVar65 = *(float *)(parentRef.ptr + 0x5c) - fStack_74;
    fStack_b0 = *(float *)(parentRef.ptr + 0x60);
    fStack_70 = *(float *)(parentRef.ptr + 0x6c);
    fVar66 = *(float *)(parentRef.ptr + 0x70) - fStack_b0;
    fVar74 = *(float *)(parentRef.ptr + 0x74) - *(float *)(parentRef.ptr + 100);
    fVar75 = *(float *)(parentRef.ptr + 0x78) - *(float *)(parentRef.ptr + 0x68);
    fVar76 = *(float *)(parentRef.ptr + 0x7c) - fStack_70;
    local_38[0] = fVar66 * fVar56 +
                  (fVar56 + fVar66) * (*(float *)(parentRef.ptr + 0x30) - local_b8);
    local_38[1] = fVar74 * fVar63 +
                  (fVar63 + fVar74) *
                  (*(float *)(parentRef.ptr + 0x34) - *(float *)(parentRef.ptr + 0x24));
    local_38[2] = fVar75 * fVar64 +
                  (fVar64 + fVar75) *
                  (*(float *)(parentRef.ptr + 0x38) - *(float *)(parentRef.ptr + 0x28));
    local_38[3] = fVar76 * fVar65 +
                  (fVar65 + fVar76) * (*(float *)(parentRef.ptr + 0x3c) - local_78);
    uStack_ac = 0;
    local_a8._4_4_ = *(float *)(parentRef.ptr + 0x44);
    local_a8._0_4_ = *(float *)(parentRef.ptr + 0x24);
    local_a8._8_4_ = *(float *)(parentRef.ptr + 100);
    local_a8._12_4_ = 0;
    local_c8._4_4_ = *(float *)(parentRef.ptr + 0x48);
    local_c8._0_4_ = *(float *)(parentRef.ptr + 0x28);
    local_c8._8_4_ = *(float *)(parentRef.ptr + 0x68);
    local_c8._12_4_ = 0;
    uStack_6c = 0;
    local_d8._4_4_ = *(float *)(parentRef.ptr + 0x50);
    local_d8._0_4_ = *(float *)(parentRef.ptr + 0x30);
    local_d8._8_4_ = *(float *)(parentRef.ptr + 0x70);
    local_d8._12_4_ = 0;
    local_98._4_4_ = *(float *)(parentRef.ptr + 0x54);
    local_98._0_4_ = *(float *)(parentRef.ptr + 0x34);
    local_98._8_4_ = *(float *)(parentRef.ptr + 0x74);
    local_98._12_4_ = 0;
    local_e8._4_4_ = *(float *)(parentRef.ptr + 0x58);
    local_e8._0_4_ = *(float *)(parentRef.ptr + 0x38);
    local_e8._8_4_ = *(float *)(parentRef.ptr + 0x78);
    local_e8._12_4_ = 0;
    local_88._4_4_ = *(float *)(parentRef.ptr + 0x5c);
    local_88._0_4_ = *(float *)(parentRef.ptr + 0x3c);
    local_88._8_4_ = *(float *)(parentRef.ptr + 0x7c);
    local_88._12_4_ = 0;
    iVar25 = (int)depth + 1;
    lVar24 = -1;
    local_17c = 0.0;
    lVar17 = 0;
    local_f8._0_4_ = -(uint)(0x20 < iVar25 + local_178[0]);
    local_f8._4_4_ = -(uint)(0x20 < iVar25 + local_178[1]);
    local_f8._8_4_ = -(uint)(0x20 < iVar25 + local_178[2]);
    local_f8._12_4_ = -(uint)(0x20 < iVar25 + local_178[3]);
    lVar14 = -1;
    lVar16 = -1;
    do {
      uVar19 = *(ulong *)(parentRef.ptr + lVar17 * 8);
      if ((uVar19 & 0x8000000000000008) == 0) {
        uVar18 = *(undefined4 *)(uVar19 + 0x68);
        uVar10 = *(undefined4 *)(uVar19 + 0x30);
        uVar11 = *(undefined4 *)(uVar19 + 0x50);
        local_118._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x40),*(undefined4 *)(uVar19 + 0x20));
        local_118._8_4_ = *(undefined4 *)(uVar19 + 0x60);
        local_118._12_4_ = 0;
        local_128._4_4_ = *(undefined4 *)(uVar19 + 0x44);
        local_128._0_4_ = *(undefined4 *)(uVar19 + 0x24);
        local_128._8_4_ = *(undefined4 *)(uVar19 + 100);
        local_128._12_4_ = 0;
        local_138._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x48),*(undefined4 *)(uVar19 + 0x28));
        local_138._8_4_ = uVar18;
        local_138._12_4_ = 0;
        auVar82._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x4c),*(undefined4 *)(uVar19 + 0x2c));
        auVar82._8_4_ = *(undefined4 *)(uVar19 + 0x6c);
        auVar82._12_4_ = 0;
        uVar12 = *(undefined4 *)(uVar19 + 0x70);
        auVar94._0_8_ = CONCAT44(uVar11,uVar10);
        auVar94._8_4_ = uVar12;
        auVar94._12_4_ = 0;
        local_158._4_4_ = *(undefined4 *)(uVar19 + 0x54);
        local_158._0_4_ = *(undefined4 *)(uVar19 + 0x34);
        local_158._8_4_ = *(undefined4 *)(uVar19 + 0x74);
        local_158._12_4_ = 0;
        local_148._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x58),*(undefined4 *)(uVar19 + 0x38));
        local_148._8_4_ = *(undefined4 *)(uVar19 + 0x78);
        local_148._12_4_ = 0;
        local_108._0_8_ = CONCAT44(*(undefined4 *)(uVar19 + 0x5c),*(undefined4 *)(uVar19 + 0x3c));
        local_108._8_4_ = *(undefined4 *)(uVar19 + 0x7c);
        local_108._12_4_ = 0;
        auVar60._4_4_ = fStack_b4;
        auVar60._0_4_ = local_b8;
        auVar60._8_4_ = fStack_b0;
        auVar60._12_4_ = 0;
        auVar78 = minps(auVar60,local_128);
        auVar69 = maxps(local_d8,local_158);
        auVar92._8_4_ = uVar18;
        auVar92._0_8_ = local_138._0_8_;
        auVar92._12_4_ = 0;
        auVar93 = minps(auVar92,auVar82);
        auVar79._8_4_ = *(undefined4 *)(uVar19 + 0x78);
        auVar79._0_8_ = local_148._0_8_;
        auVar79._12_4_ = 0;
        local_68 = maxps(auVar79,local_108);
        auVar89._8_4_ = *(undefined4 *)(uVar19 + 0x7c);
        auVar89._0_8_ = local_108._0_8_;
        auVar89._12_4_ = 0;
        auVar78 = minps(auVar78,auVar93);
        auVar69 = maxps(auVar69,local_68);
        fVar56 = auVar69._0_4_ - auVar78._0_4_;
        fVar63 = auVar69._4_4_ - auVar78._4_4_;
        fVar64 = auVar69._8_4_ - auVar78._8_4_;
        auVar69._8_4_ = *(undefined4 *)(uVar19 + 0x60);
        auVar69._0_8_ = local_118._0_8_;
        auVar69._12_4_ = 0;
        auVar78 = minps(auVar69,auVar60);
        auVar80._8_4_ = uVar12;
        auVar80._0_8_ = auVar94._0_8_;
        auVar80._12_4_ = 0;
        auVar69 = maxps(auVar80,local_d8);
        auVar78 = minps(auVar78,auVar93);
        auVar69 = maxps(auVar69,local_68);
        fVar65 = auVar69._0_4_ - auVar78._0_4_;
        fVar66 = auVar69._4_4_ - auVar78._4_4_;
        fVar74 = auVar69._8_4_ - auVar78._8_4_;
        auVar84 = minps(local_118,local_128);
        auVar86._4_4_ = uVar11;
        auVar86._0_4_ = uVar10;
        auVar86._8_4_ = uVar12;
        auVar86._12_4_ = 0;
        auVar67 = maxps(auVar86,local_158);
        auVar78 = minps(auVar60,auVar82);
        local_58._8_4_ = *(undefined4 *)(uVar19 + 0x6c);
        local_58._0_8_ = auVar82._0_8_;
        local_58._12_4_ = 0;
        auVar69 = minps(auVar84,auVar78);
        auVar78 = maxps(local_d8,auVar89);
        auVar78 = maxps(auVar67,auVar78);
        fVar88 = auVar78._0_4_ - auVar69._0_4_;
        fVar90 = auVar78._4_4_ - auVar69._4_4_;
        fVar91 = auVar78._8_4_ - auVar69._8_4_;
        auVar46._8_4_ = uVar18;
        auVar46._0_8_ = local_138._0_8_;
        auVar46._12_4_ = 0;
        auVar60 = minps(auVar46,auVar60);
        auVar78 = minps(auVar84,auVar60);
        auVar60 = maxps(local_148,local_d8);
        auVar60 = maxps(auVar67,auVar60);
        fVar75 = auVar60._0_4_ - auVar78._0_4_;
        fVar76 = auVar60._4_4_ - auVar78._4_4_;
        fVar83 = auVar60._8_4_ - auVar78._8_4_;
        auVar41._0_4_ = fVar56 * fVar64 + fVar64 * fVar63 + fVar63 * fVar56;
        auVar41._4_4_ = fVar65 * fVar74 + fVar74 * fVar66 + fVar66 * fVar65;
        auVar41._8_4_ = fVar88 * fVar91 + fVar91 * fVar90 + fVar90 * fVar88;
        auVar41._12_4_ = fVar75 * fVar83 + fVar83 * fVar76 + fVar76 * fVar75;
        auVar58._4_4_ = auVar41._0_4_;
        auVar58._0_4_ = auVar41._4_4_;
        auVar58._8_4_ = auVar41._12_4_;
        auVar58._12_4_ = auVar41._8_4_;
        auVar60 = minps(auVar58,auVar41);
        auVar85._0_8_ = auVar60._8_8_;
        auVar85._8_4_ = auVar60._0_4_;
        auVar85._12_4_ = auVar60._4_4_;
        auVar86 = minps(auVar85,auVar60);
        auVar42._4_4_ = -(uint)(auVar41._4_4_ == auVar86._4_4_);
        auVar42._0_4_ = -(uint)(auVar41._0_4_ == auVar86._0_4_);
        auVar42._8_4_ = -(uint)(auVar41._8_4_ == auVar86._8_4_);
        auVar42._12_4_ = -(uint)(auVar41._12_4_ == auVar86._12_4_);
        uVar18 = movmskps((int)uVar19,auVar42);
        uVar19 = CONCAT44((int)(uVar19 >> 0x20),uVar18);
        auVar60 = minps(local_a8,local_128);
        auVar78 = maxps(local_98,local_158);
        auVar60 = minps(auVar60,auVar93);
        auVar78 = maxps(auVar78,local_68);
        fVar56 = auVar78._0_4_ - auVar60._0_4_;
        fVar64 = auVar78._4_4_ - auVar60._4_4_;
        fVar66 = auVar78._8_4_ - auVar60._8_4_;
        auVar60 = minps(local_118,local_a8);
        auVar35._4_4_ = uVar11;
        auVar35._0_4_ = uVar10;
        auVar35._8_4_ = uVar12;
        auVar35._12_4_ = 0;
        auVar78 = maxps(auVar35,local_98);
        auVar60 = minps(auVar60,auVar93);
        auVar78 = maxps(auVar78,local_68);
        fVar63 = auVar78._0_4_ - auVar60._0_4_;
        fVar65 = auVar78._4_4_ - auVar60._4_4_;
        fVar74 = auVar78._8_4_ - auVar60._8_4_;
        auVar60 = minps(local_a8,local_58);
        auVar78 = minps(auVar84,auVar60);
        auVar60 = maxps(local_98,local_108);
        auVar60 = maxps(auVar67,auVar60);
        fVar75 = auVar60._0_4_ - auVar78._0_4_;
        fVar83 = auVar60._4_4_ - auVar78._4_4_;
        fVar90 = auVar60._8_4_ - auVar78._8_4_;
        auVar60 = minps(local_138,local_a8);
        auVar78 = minps(auVar84,auVar60);
        auVar60 = maxps(local_148,local_98);
        auVar60 = maxps(auVar67,auVar60);
        fVar76 = auVar60._0_4_ - auVar78._0_4_;
        fVar88 = auVar60._4_4_ - auVar78._4_4_;
        fVar91 = auVar60._8_4_ - auVar78._8_4_;
        auVar43._0_4_ = fVar56 * fVar66 + fVar66 * fVar64 + fVar64 * fVar56;
        auVar43._4_4_ = fVar63 * fVar74 + fVar74 * fVar65 + fVar65 * fVar63;
        auVar43._8_4_ = fVar75 * fVar90 + fVar90 * fVar83 + fVar83 * fVar75;
        auVar43._12_4_ = fVar76 * fVar91 + fVar91 * fVar88 + fVar88 * fVar76;
        auVar28._4_4_ = auVar43._0_4_;
        auVar28._0_4_ = auVar43._4_4_;
        auVar28._8_4_ = auVar43._12_4_;
        auVar28._12_4_ = auVar43._8_4_;
        auVar60 = minps(auVar28,auVar43);
        auVar81._0_8_ = auVar60._8_8_;
        auVar81._8_4_ = auVar60._0_4_;
        auVar81._12_4_ = auVar60._4_4_;
        auVar58 = minps(auVar81,auVar60);
        auVar44._4_4_ = -(uint)(auVar43._4_4_ == auVar58._4_4_);
        auVar44._0_4_ = -(uint)(auVar43._0_4_ == auVar58._0_4_);
        auVar44._8_4_ = -(uint)(auVar43._8_4_ == auVar58._8_4_);
        auVar44._12_4_ = -(uint)(auVar43._12_4_ == auVar58._12_4_);
        uVar18 = movmskps((int)in_R8,auVar44);
        uVar20 = CONCAT44((int)((ulong)in_R8 >> 0x20),uVar18);
        auVar60 = minps(local_c8,local_128);
        auVar78 = maxps(local_e8,local_158);
        auVar60 = minps(auVar60,auVar93);
        auVar78 = maxps(auVar78,local_68);
        fVar56 = auVar78._0_4_ - auVar60._0_4_;
        fVar64 = auVar78._4_4_ - auVar60._4_4_;
        fVar66 = auVar78._8_4_ - auVar60._8_4_;
        auVar60 = minps(local_118,local_c8);
        auVar36._4_4_ = uVar11;
        auVar36._0_4_ = uVar10;
        auVar36._8_4_ = uVar12;
        auVar36._12_4_ = 0;
        auVar78 = maxps(auVar36,local_e8);
        auVar60 = minps(auVar60,auVar93);
        auVar78 = maxps(auVar78,local_68);
        fVar63 = auVar78._0_4_ - auVar60._0_4_;
        fVar65 = auVar78._4_4_ - auVar60._4_4_;
        fVar74 = auVar78._8_4_ - auVar60._8_4_;
        auVar60 = minps(local_c8,local_58);
        auVar78 = minps(auVar84,auVar60);
        auVar60 = maxps(local_e8,local_108);
        auVar60 = maxps(auVar67,auVar60);
        fVar75 = auVar60._0_4_ - auVar78._0_4_;
        fVar76 = auVar60._4_4_ - auVar78._4_4_;
        fVar83 = auVar60._8_4_ - auVar78._8_4_;
        auVar60 = minps(local_138,local_c8);
        auVar78 = minps(auVar84,auVar60);
        auVar60 = maxps(local_148,local_e8);
        auVar60 = maxps(auVar67,auVar60);
        fVar88 = auVar60._0_4_ - auVar78._0_4_;
        fVar90 = auVar60._4_4_ - auVar78._4_4_;
        fVar91 = auVar60._8_4_ - auVar78._8_4_;
        auVar50._0_4_ = fVar56 * fVar66 + fVar66 * fVar64 + fVar64 * fVar56;
        auVar50._4_4_ = fVar63 * fVar74 + fVar74 * fVar65 + fVar65 * fVar63;
        auVar50._8_4_ = fVar75 * fVar83 + fVar83 * fVar76 + fVar76 * fVar75;
        auVar50._12_4_ = fVar88 * fVar91 + fVar91 * fVar90 + fVar90 * fVar88;
        auVar29._4_4_ = auVar50._0_4_;
        auVar29._0_4_ = auVar50._4_4_;
        auVar29._8_4_ = auVar50._12_4_;
        auVar29._12_4_ = auVar50._8_4_;
        auVar60 = minps(auVar29,auVar50);
        auVar45._0_8_ = auVar60._8_8_;
        auVar45._8_4_ = auVar60._0_4_;
        auVar45._12_4_ = auVar60._4_4_;
        auVar46 = minps(auVar45,auVar60);
        auVar51._4_4_ = -(uint)(auVar50._4_4_ == auVar46._4_4_);
        auVar51._0_4_ = -(uint)(auVar50._0_4_ == auVar46._0_4_);
        auVar51._8_4_ = -(uint)(auVar50._8_4_ == auVar46._8_4_);
        auVar51._12_4_ = -(uint)(auVar50._12_4_ == auVar46._12_4_);
        uVar18 = movmskps((int)in_R9,auVar51);
        uVar22 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar18);
        auVar78._4_4_ = fStack_74;
        auVar78._0_4_ = local_78;
        auVar78._8_4_ = fStack_70;
        auVar78._12_4_ = 0;
        auVar60 = minps(auVar78,local_128);
        auVar69 = maxps(local_88,local_158);
        auVar60 = minps(auVar60,auVar93);
        auVar69 = maxps(auVar69,local_68);
        fVar56 = auVar69._0_4_ - auVar60._0_4_;
        fVar63 = auVar69._4_4_ - auVar60._4_4_;
        fVar64 = auVar69._8_4_ - auVar60._8_4_;
        auVar60 = minps(local_118,auVar78);
        auVar60 = minps(auVar60,auVar93);
        auVar69 = maxps(auVar94,local_88);
        auVar69 = maxps(auVar69,local_68);
        fVar88 = auVar69._0_4_ - auVar60._0_4_;
        fVar90 = auVar69._4_4_ - auVar60._4_4_;
        fVar91 = auVar69._8_4_ - auVar60._8_4_;
        auVar60 = minps(auVar78,local_58);
        auVar69 = maxps(local_88,local_108);
        auVar60 = minps(auVar84,auVar60);
        auVar69 = maxps(auVar67,auVar69);
        fVar75 = auVar69._0_4_ - auVar60._0_4_;
        fVar76 = auVar69._4_4_ - auVar60._4_4_;
        fVar83 = auVar69._8_4_ - auVar60._8_4_;
        auVar60 = minps(local_138,auVar78);
        auVar78 = maxps(local_148,local_88);
        auVar69 = minps(auVar84,auVar60);
        auVar60 = maxps(auVar67,auVar78);
        fVar65 = auVar60._0_4_ - auVar69._0_4_;
        fVar66 = auVar60._4_4_ - auVar69._4_4_;
        fVar74 = auVar60._8_4_ - auVar69._8_4_;
        auVar93._0_4_ = fVar56 * fVar64 + fVar64 * fVar63 + fVar63 * fVar56;
        auVar93._4_4_ = fVar88 * fVar91 + fVar91 * fVar90 + fVar90 * fVar88;
        auVar93._8_4_ = fVar75 * fVar83 + fVar83 * fVar76 + fVar76 * fVar75;
        auVar93._12_4_ = fVar65 * fVar74 + fVar74 * fVar66 + fVar66 * fVar65;
        auVar67._4_4_ = auVar93._0_4_;
        auVar67._0_4_ = auVar93._4_4_;
        auVar67._8_4_ = auVar93._12_4_;
        auVar67._12_4_ = auVar93._8_4_;
        auVar60 = minps(auVar67,auVar93);
        auVar84._0_8_ = auVar60._8_8_;
        auVar84._8_4_ = auVar60._0_4_;
        auVar84._12_4_ = auVar60._4_4_;
        auVar60 = minps(auVar84,auVar60);
        auVar52._4_4_ = -(uint)(auVar93._4_4_ == auVar60._4_4_);
        auVar52._0_4_ = -(uint)(auVar93._0_4_ == auVar60._0_4_);
        auVar52._8_4_ = -(uint)(auVar93._8_4_ == auVar60._8_4_);
        auVar52._12_4_ = -(uint)(auVar93._12_4_ == auVar60._12_4_);
        uVar18 = movmskps((int)in_R10,auVar52);
        uVar23 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar18);
        lVar15 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        in_R8 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> in_R8 & 1) == 0; in_R8 = in_R8 + 1) {
          }
        }
        in_R9 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> in_R9 & 1) == 0; in_R9 = in_R9 + 1) {
          }
        }
        in_R10 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> in_R10 & 1) == 0; in_R10 = in_R10 + 1) {
          }
        }
        fVar56 = local_38[lVar17];
        local_48._0_4_ = auVar86._0_4_ - fVar56;
        local_48._4_4_ = auVar58._0_4_ - fVar56;
        local_48._8_4_ = auVar46._0_4_ - fVar56;
        local_48._12_4_ = auVar60._0_4_ - fVar56;
        local_168[0] = (int)lVar15;
        local_168[1] = (int)in_R8;
        local_168[2] = (int)in_R9;
        local_168[3] = (int)in_R10;
        iVar25 = (int)lVar17;
        auVar30._0_4_ = -(uint)(iVar25 == 0);
        auVar30._4_4_ = -(uint)(iVar25 == 1);
        auVar30._8_4_ = -(uint)(iVar25 == 2);
        auVar30._12_4_ = -(uint)(iVar25 == 3);
        auVar30 = auVar30 | local_f8;
        iVar25 = movmskps((int)lVar15,auVar30);
        if (iVar25 != 0xf) {
          uVar27 = auVar30._0_4_ ^ 0xffffffff;
          uVar34 = auVar30._4_4_ ^ 0xffffffff;
          auVar31._0_8_ = auVar30._0_8_ ^ 0xffffffffffffffff;
          auVar31._8_4_ = auVar30._8_4_ ^ 0xffffffff;
          auVar31._12_4_ = auVar30._12_4_ ^ 0xffffffff;
          auVar87._0_4_ = (uint)local_48._0_4_ & uVar27;
          auVar87._4_4_ = (uint)local_48._4_4_ & uVar34;
          auVar87._8_4_ = (uint)local_48._8_4_ & auVar31._8_4_;
          auVar87._12_4_ = (uint)local_48._12_4_ & auVar31._12_4_;
          auVar47._0_8_ = CONCAT44(~uVar34,~uVar27) & 0x7f8000007f800000;
          auVar47._8_4_ = ~auVar31._8_4_ & 0x7f800000;
          auVar47._12_4_ = ~auVar31._12_4_ & 0x7f800000;
          auVar47 = auVar47 | auVar87;
          auVar53._4_4_ = auVar47._0_4_;
          auVar53._0_4_ = auVar47._4_4_;
          auVar53._8_4_ = auVar47._12_4_;
          auVar53._12_4_ = auVar47._8_4_;
          auVar60 = minps(auVar53,auVar47);
          auVar37._0_8_ = auVar60._8_8_;
          auVar37._8_4_ = auVar60._0_4_;
          auVar37._12_4_ = auVar60._4_4_;
          auVar60 = minps(auVar37,auVar60);
          auVar38._0_8_ =
               CONCAT44(-(uint)(auVar60._4_4_ == auVar47._4_4_) & uVar34,
                        -(uint)(auVar60._0_4_ == auVar47._0_4_) & uVar27);
          auVar38._8_4_ = -(uint)(auVar60._8_4_ == auVar47._8_4_) & auVar31._8_4_;
          auVar38._12_4_ = -(uint)(auVar60._12_4_ == auVar47._12_4_) & auVar31._12_4_;
          iVar25 = movmskps(iVar25,auVar38);
          if (iVar25 != 0) {
            auVar31._8_4_ = auVar38._8_4_;
            auVar31._0_8_ = auVar38._0_8_;
            auVar31._12_4_ = auVar38._12_4_;
          }
          uVar18 = movmskps(iVar25,auVar31);
          uVar19 = CONCAT44((int)((ulong)lVar15 >> 0x20),uVar18);
          lVar15 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          if ((lVar17 != lVar15) && (local_38[lVar15 + -4] < local_17c)) {
            lVar16 = (long)local_168[lVar15];
            lVar24 = lVar15;
            lVar14 = lVar17;
            local_17c = local_38[lVar15 + -4];
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    if (lVar24 != -1) {
      lVar17 = *(long *)(parentRef.ptr + lVar14 * 8);
      uVar3 = *(undefined8 *)(parentRef.ptr + lVar24 * 8);
      *(undefined8 *)(parentRef.ptr + lVar24 * 8) = *(undefined8 *)(lVar17 + lVar16 * 8);
      *(undefined8 *)(lVar17 + lVar16 * 8) = uVar3;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar24 * 4);
      *(undefined4 *)(parentRef.ptr + 0x20 + lVar24 * 4) =
           *(undefined4 *)(lVar17 + 0x20 + lVar16 * 4);
      *(undefined4 *)(lVar17 + 0x20 + lVar16 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar24 * 4);
      *(undefined4 *)(parentRef.ptr + 0x40 + lVar24 * 4) =
           *(undefined4 *)(lVar17 + 0x40 + lVar16 * 4);
      *(undefined4 *)(lVar17 + 0x40 + lVar16 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar24 * 4);
      *(undefined4 *)(parentRef.ptr + 0x60 + lVar24 * 4) =
           *(undefined4 *)(lVar17 + 0x60 + lVar16 * 4);
      *(undefined4 *)(lVar17 + 0x60 + lVar16 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar24 * 4);
      *(undefined4 *)(parentRef.ptr + 0x30 + lVar24 * 4) =
           *(undefined4 *)(lVar17 + 0x30 + lVar16 * 4);
      *(undefined4 *)(lVar17 + 0x30 + lVar16 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar24 * 4);
      *(undefined4 *)(parentRef.ptr + 0x50 + lVar24 * 4) =
           *(undefined4 *)(lVar17 + 0x50 + lVar16 * 4);
      *(undefined4 *)(lVar17 + 0x50 + lVar16 * 4) = uVar18;
      uVar18 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar24 * 4);
      *(undefined4 *)(parentRef.ptr + 0x70 + lVar24 * 4) =
           *(undefined4 *)(lVar17 + 0x70 + lVar16 * 4);
      *(undefined4 *)(lVar17 + 0x70 + lVar16 * 4) = uVar18;
      auVar60 = *(undefined1 (*) [16])(lVar17 + 0x20);
      auVar78 = *(undefined1 (*) [16])(lVar17 + 0x30);
      auVar69 = *(undefined1 (*) [16])(lVar17 + 0x40);
      auVar46 = *(undefined1 (*) [16])(lVar17 + 0x50);
      auVar57._4_4_ = auVar60._0_4_;
      auVar57._0_4_ = auVar60._4_4_;
      auVar57._8_4_ = auVar60._12_4_;
      auVar57._12_4_ = auVar60._8_4_;
      auVar58 = minps(auVar57,auVar60);
      auVar4._4_8_ = auVar60._8_8_;
      auVar4._0_4_ = auVar58._4_4_;
      auVar32._0_8_ = auVar4._0_8_ << 0x20;
      auVar32._8_4_ = auVar58._8_4_;
      auVar32._12_4_ = auVar58._12_4_;
      auVar33._8_8_ = auVar58._8_8_;
      auVar33._0_8_ = auVar32._8_8_;
      if (auVar58._0_4_ <= auVar58._8_4_) {
        auVar33._0_4_ = auVar58._0_4_;
      }
      auVar59._4_4_ = auVar69._0_4_;
      auVar59._0_4_ = auVar69._4_4_;
      auVar59._8_4_ = auVar69._12_4_;
      auVar59._12_4_ = auVar69._8_4_;
      auVar60 = minps(auVar59,auVar69);
      auVar5._4_8_ = auVar69._8_8_;
      auVar5._0_4_ = auVar60._4_4_;
      auVar39._0_8_ = auVar5._0_8_ << 0x20;
      auVar39._8_4_ = auVar60._8_4_;
      auVar39._12_4_ = auVar60._12_4_;
      auVar40._8_8_ = auVar60._8_8_;
      auVar40._0_8_ = auVar39._8_8_;
      if (auVar60._0_4_ <= auVar60._8_4_) {
        auVar40._0_4_ = auVar60._0_4_;
      }
      auVar60 = *(undefined1 (*) [16])(lVar17 + 0x60);
      auVar68._4_4_ = auVar60._0_4_;
      auVar68._0_4_ = auVar60._4_4_;
      auVar68._8_4_ = auVar60._12_4_;
      auVar68._12_4_ = auVar60._8_4_;
      auVar69 = minps(auVar68,auVar60);
      auVar6._4_8_ = auVar60._8_8_;
      auVar6._0_4_ = auVar69._4_4_;
      auVar61._0_8_ = auVar6._0_8_ << 0x20;
      auVar61._8_4_ = auVar69._8_4_;
      auVar61._12_4_ = auVar69._12_4_;
      auVar62._8_8_ = auVar69._8_8_;
      auVar62._0_8_ = auVar61._8_8_;
      if (auVar69._0_4_ <= auVar69._8_4_) {
        auVar62._0_4_ = auVar69._0_4_;
      }
      auVar70._4_4_ = auVar78._0_4_;
      auVar70._0_4_ = auVar78._4_4_;
      auVar70._8_4_ = auVar78._12_4_;
      auVar70._12_4_ = auVar78._8_4_;
      auVar60 = maxps(auVar70,auVar78);
      auVar7._4_8_ = auVar78._8_8_;
      auVar7._0_4_ = auVar60._4_4_;
      auVar54._0_8_ = auVar7._0_8_ << 0x20;
      auVar54._8_4_ = auVar60._8_4_;
      auVar54._12_4_ = auVar60._12_4_;
      auVar55._8_8_ = auVar60._8_8_;
      auVar55._0_8_ = auVar54._8_8_;
      if (auVar60._8_4_ <= auVar60._0_4_) {
        auVar55._0_4_ = auVar60._0_4_;
      }
      auVar71._4_4_ = auVar46._0_4_;
      auVar71._0_4_ = auVar46._4_4_;
      auVar71._8_4_ = auVar46._12_4_;
      auVar71._12_4_ = auVar46._8_4_;
      auVar60 = maxps(auVar71,auVar46);
      auVar8._4_8_ = auVar46._8_8_;
      auVar8._0_4_ = auVar60._4_4_;
      auVar48._0_8_ = auVar8._0_8_ << 0x20;
      auVar48._8_4_ = auVar60._8_4_;
      auVar48._12_4_ = auVar60._12_4_;
      auVar49._8_8_ = auVar60._8_8_;
      auVar49._0_8_ = auVar48._8_8_;
      if (auVar60._8_4_ <= auVar60._0_4_) {
        auVar49._0_4_ = auVar60._0_4_;
      }
      auVar60 = *(undefined1 (*) [16])(lVar17 + 0x70);
      auVar77._4_4_ = auVar60._0_4_;
      auVar77._0_4_ = auVar60._4_4_;
      auVar77._8_4_ = auVar60._12_4_;
      auVar77._12_4_ = auVar60._8_4_;
      auVar78 = maxps(auVar77,auVar60);
      auVar9._4_8_ = auVar60._8_8_;
      auVar9._0_4_ = auVar78._4_4_;
      auVar72._0_8_ = auVar9._0_8_ << 0x20;
      auVar72._8_4_ = auVar78._8_4_;
      auVar72._12_4_ = auVar78._12_4_;
      auVar73._8_8_ = auVar78._8_8_;
      auVar73._0_8_ = auVar72._8_8_;
      if (auVar78._8_4_ <= auVar78._0_4_) {
        auVar73._0_4_ = auVar78._0_4_;
      }
      *(int *)(parentRef.ptr + 0x20 + lVar14 * 4) = auVar33._0_4_;
      *(int *)(parentRef.ptr + 0x40 + lVar14 * 4) = auVar40._0_4_;
      *(int *)(parentRef.ptr + 0x60 + lVar14 * 4) = auVar62._0_4_;
      *(int *)(parentRef.ptr + 0x30 + lVar14 * 4) = auVar55._0_4_;
      *(int *)(parentRef.ptr + 0x50 + lVar14 * 4) = auVar49._0_4_;
      *(int *)(parentRef.ptr + 0x70 + lVar14 * 4) = auVar73._0_4_;
      lVar14 = 3;
      do {
        if (*(long *)(parentRef.ptr + lVar14 * 8) != 8) {
          if (0 < lVar14) {
            lVar16 = 0;
            do {
              if (*(long *)(parentRef.ptr + lVar16 * 8) == 8) {
                *(undefined8 *)(parentRef.ptr + lVar16 * 8) =
                     *(undefined8 *)(parentRef.ptr + lVar14 * 8);
                *(undefined8 *)(parentRef.ptr + lVar14 * 8) = 8;
                uVar18 = *(undefined4 *)(parentRef.ptr + 0x20 + lVar16 * 4);
                *(undefined4 *)(parentRef.ptr + 0x20 + lVar16 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x20 + lVar14 * 4);
                *(undefined4 *)(parentRef.ptr + 0x20 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(parentRef.ptr + 0x40 + lVar16 * 4);
                *(undefined4 *)(parentRef.ptr + 0x40 + lVar16 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x40 + lVar14 * 4);
                *(undefined4 *)(parentRef.ptr + 0x40 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(parentRef.ptr + 0x60 + lVar16 * 4);
                *(undefined4 *)(parentRef.ptr + 0x60 + lVar16 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x60 + lVar14 * 4);
                *(undefined4 *)(parentRef.ptr + 0x60 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(parentRef.ptr + 0x30 + lVar16 * 4);
                *(undefined4 *)(parentRef.ptr + 0x30 + lVar16 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x30 + lVar14 * 4);
                *(undefined4 *)(parentRef.ptr + 0x30 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(parentRef.ptr + 0x50 + lVar16 * 4);
                *(undefined4 *)(parentRef.ptr + 0x50 + lVar16 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x50 + lVar14 * 4);
                *(undefined4 *)(parentRef.ptr + 0x50 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(parentRef.ptr + 0x70 + lVar16 * 4);
                *(undefined4 *)(parentRef.ptr + 0x70 + lVar16 * 4) =
                     *(undefined4 *)(parentRef.ptr + 0x70 + lVar14 * 4);
                *(undefined4 *)(parentRef.ptr + 0x70 + lVar14 * 4) = uVar18;
                lVar15 = lVar14;
                lVar21 = lVar14 + -1;
                if (lVar16 < lVar14 + -1) {
                  lVar21 = lVar16;
                }
                do {
                  lVar1 = lVar15 + -1;
                  lVar14 = lVar21;
                  if (lVar1 <= lVar16) break;
                  lVar2 = lVar15 * 8;
                  lVar15 = lVar1;
                  lVar14 = lVar1;
                } while (*(long *)((parentRef.ptr - 8) + lVar2) == 8);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < lVar14);
          }
          break;
        }
        bVar26 = lVar14 != 0;
        lVar14 = lVar14 + -1;
      } while (bVar26);
      lVar14 = 3;
      do {
        if (*(long *)(lVar17 + lVar14 * 8) != 8) {
          if (0 < lVar14) {
            lVar16 = 0;
            do {
              if (*(long *)(lVar17 + lVar16 * 8) == 8) {
                *(undefined8 *)(lVar17 + lVar16 * 8) = *(undefined8 *)(lVar17 + lVar14 * 8);
                *(undefined8 *)(lVar17 + lVar14 * 8) = 8;
                uVar18 = *(undefined4 *)(lVar17 + 0x20 + lVar16 * 4);
                *(undefined4 *)(lVar17 + 0x20 + lVar16 * 4) =
                     *(undefined4 *)(lVar17 + 0x20 + lVar14 * 4);
                *(undefined4 *)(lVar17 + 0x20 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(lVar17 + 0x40 + lVar16 * 4);
                *(undefined4 *)(lVar17 + 0x40 + lVar16 * 4) =
                     *(undefined4 *)(lVar17 + 0x40 + lVar14 * 4);
                *(undefined4 *)(lVar17 + 0x40 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(lVar17 + 0x60 + lVar16 * 4);
                *(undefined4 *)(lVar17 + 0x60 + lVar16 * 4) =
                     *(undefined4 *)(lVar17 + 0x60 + lVar14 * 4);
                *(undefined4 *)(lVar17 + 0x60 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(lVar17 + 0x30 + lVar16 * 4);
                *(undefined4 *)(lVar17 + 0x30 + lVar16 * 4) =
                     *(undefined4 *)(lVar17 + 0x30 + lVar14 * 4);
                *(undefined4 *)(lVar17 + 0x30 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(lVar17 + 0x50 + lVar16 * 4);
                *(undefined4 *)(lVar17 + 0x50 + lVar16 * 4) =
                     *(undefined4 *)(lVar17 + 0x50 + lVar14 * 4);
                *(undefined4 *)(lVar17 + 0x50 + lVar14 * 4) = uVar18;
                uVar18 = *(undefined4 *)(lVar17 + 0x70 + lVar16 * 4);
                *(undefined4 *)(lVar17 + 0x70 + lVar16 * 4) =
                     *(undefined4 *)(lVar17 + 0x70 + lVar14 * 4);
                *(undefined4 *)(lVar17 + 0x70 + lVar14 * 4) = uVar18;
                lVar15 = lVar14;
                lVar21 = lVar14 + -1;
                if (lVar16 < lVar14 + -1) {
                  lVar21 = lVar16;
                }
                do {
                  lVar1 = lVar15 + -1;
                  lVar14 = lVar21;
                  if (lVar1 <= lVar16) break;
                  lVar2 = lVar15 * 8;
                  lVar15 = lVar1;
                  lVar14 = lVar1;
                } while (*(long *)(lVar17 + -8 + lVar2) == 8);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < lVar14);
          }
          break;
        }
        bVar26 = lVar14 != 0;
        lVar14 = lVar14 + -1;
      } while (bVar26);
      local_178[lVar24] = local_178[lVar24] + 1;
    }
    if (local_178[1] < local_178[0]) {
      local_178[1] = local_178[0];
    }
    if (local_178[3] < local_178[2]) {
      local_178[3] = local_178[2];
    }
    if (local_178[3] < local_178[1]) {
      local_178[3] = local_178[1];
    }
    sVar13 = (size_t)(local_178[3] + 1);
  }
  else {
    sVar13 = 0;
  }
  return sVar13;
}

Assistant:

size_t BVHNRotate<4>::rotate(NodeRef parentRef, size_t depth)
    {
      /*! nothing to rotate if we reached a leaf node. */
      if (parentRef.isBarrier()) return 0;
      if (parentRef.isLeaf()) return 0;
      AABBNode* parent = parentRef.getAABBNode();
      
      /*! rotate all children first */
      vint4 cdepth;
      for (size_t c=0; c<4; c++)
	cdepth[c] = (int)rotate(parent->child(c),depth+1);
      
      /* compute current areas of all children */
      vfloat4 sizeX = parent->upper_x-parent->lower_x;
      vfloat4 sizeY = parent->upper_y-parent->lower_y;
      vfloat4 sizeZ = parent->upper_z-parent->lower_z;
      vfloat4 childArea = madd(sizeX,(sizeY + sizeZ),sizeY*sizeZ);
      
      /*! get node bounds */
      BBox<vfloat4> child1_0,child1_1,child1_2,child1_3;
      parent->bounds(child1_0,child1_1,child1_2,child1_3);
      
      /*! Find best rotation. We pick a first child (child1) and a sub-child 
	(child2child) of a different second child (child2), and swap child1 
	and child2child. We perform the best such swap. */
      float bestArea = 0;
      size_t bestChild1 = -1, bestChild2 = -1, bestChild2Child = -1;
      for (size_t c2=0; c2<4; c2++)
      {
	/*! ignore leaf nodes as we cannot descent into them */
	if (parent->child(c2).isBarrier()) continue;
	if (parent->child(c2).isLeaf()) continue;
	AABBNode* child2 = parent->child(c2).getAABBNode();
	
	/*! transpose child bounds */
	BBox<vfloat4> child2c0,child2c1,child2c2,child2c3;
	child2->bounds(child2c0,child2c1,child2c2,child2c3);
	
	/*! put child1_0 at each child2 position */
	float cost00 = halfArea3f(merge(child1_0,child2c1,child2c2,child2c3));
	float cost01 = halfArea3f(merge(child2c0,child1_0,child2c2,child2c3));
	float cost02 = halfArea3f(merge(child2c0,child2c1,child1_0,child2c3));
	float cost03 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_0));
	vfloat4 cost0 = vfloat4(cost00,cost01,cost02,cost03);
	vfloat4 min0 = vreduce_min(cost0);
	int pos0 = (int)bsf(movemask(min0 == cost0));
	
	/*! put child1_1 at each child2 position */
	float cost10 = halfArea3f(merge(child1_1,child2c1,child2c2,child2c3));
	float cost11 = halfArea3f(merge(child2c0,child1_1,child2c2,child2c3));
	float cost12 = halfArea3f(merge(child2c0,child2c1,child1_1,child2c3));
	float cost13 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_1));
	vfloat4 cost1 = vfloat4(cost10,cost11,cost12,cost13);
	vfloat4 min1 = vreduce_min(cost1);
	int pos1 = (int)bsf(movemask(min1 == cost1));
	
	/*! put child1_2 at each child2 position */
	float cost20 = halfArea3f(merge(child1_2,child2c1,child2c2,child2c3));
	float cost21 = halfArea3f(merge(child2c0,child1_2,child2c2,child2c3));
	float cost22 = halfArea3f(merge(child2c0,child2c1,child1_2,child2c3));
	float cost23 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_2));
	vfloat4 cost2 = vfloat4(cost20,cost21,cost22,cost23);
	vfloat4 min2 = vreduce_min(cost2);
	int pos2 = (int)bsf(movemask(min2 == cost2));
	
	/*! put child1_3 at each child2 position */
	float cost30 = halfArea3f(merge(child1_3,child2c1,child2c2,child2c3));
	float cost31 = halfArea3f(merge(child2c0,child1_3,child2c2,child2c3));
	float cost32 = halfArea3f(merge(child2c0,child2c1,child1_3,child2c3));
	float cost33 = halfArea3f(merge(child2c0,child2c1,child2c2,child1_3));
	vfloat4 cost3 = vfloat4(cost30,cost31,cost32,cost33);
	vfloat4 min3 = vreduce_min(cost3);
	int pos3 = (int)bsf(movemask(min3 == cost3));
	
	/*! find best other child */
	vfloat4 area0123 = vfloat4(extract<0>(min0),extract<0>(min1),extract<0>(min2),extract<0>(min3)) - vfloat4(childArea[c2]);
	int pos[4] = { pos0,pos1,pos2,pos3 };
	const size_t mbd = BVH4::maxBuildDepth;
	vbool4 valid = vint4(int(depth+1))+cdepth <= vint4(mbd); // only select swaps that fulfill depth constraints
	valid &= vint4(int(c2)) != vint4(step);
	if (none(valid)) continue;
	size_t c1 = select_min(valid,area0123);
	float area = area0123[c1]; 
        if (c1 == c2) continue; // can happen if bounds are NANs
	
	/*! accept a swap when it reduces cost and is not swapping a node with itself */
	if (area < bestArea) {
	  bestArea = area;
	  bestChild1 = c1;
	  bestChild2 = c2;
	  bestChild2Child = pos[c1];
	}
      }
      
      /*! if we did not find a swap that improves the SAH then do nothing */
      if (bestChild1 == size_t(-1)) return 1+reduce_max(cdepth);
      
      /*! perform the best found tree rotation */
      AABBNode* child2 = parent->child(bestChild2).getAABBNode();
      AABBNode::swap(parent,bestChild1,child2,bestChild2Child);
      parent->setBounds(bestChild2,child2->bounds());
      AABBNode::compact(parent);
      AABBNode::compact(child2);
      
      /*! This returned depth is conservative as the child that was
       *  pulled up in the tree could have been on the critical path. */
      cdepth[bestChild1]++; // bestChild1 was pushed down one level
      return 1+reduce_max(cdepth); 
    }